

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::LoadIniSettingsFromMemory(char *ini_data,size_t ini_size)

{
  int *piVar1;
  char *pcVar2;
  ImGuiContext *pIVar3;
  char *__dest;
  char *pcVar4;
  undefined1 *puVar5;
  void *pvVar6;
  ImGuiSettingsHandler *pIVar7;
  ImGuiContext *ctx;
  char *pcVar8;
  
  pIVar3 = GImGui;
  if (GImGui->Initialized == false) {
    __assert_fail("g.Initialized",
                  "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/gui/imgui/imgui.cpp"
                  ,0x2448,"void ImGui::LoadIniSettingsFromMemory(const char *, size_t)");
  }
  if ((GImGui->SettingsLoaded == false) && (GImGui->FrameCount == 0)) {
    if (ini_size == 0) {
      ini_size = strlen(ini_data);
    }
    piVar1 = &(pIVar3->IO).MetricsActiveAllocations;
    *piVar1 = *piVar1 + 1;
    __dest = (char *)(*GImAllocatorAllocFunc)(ini_size + 1,GImAllocatorUserData);
    memcpy(__dest,ini_data,ini_size);
    __dest[ini_size] = '\0';
    if (0 < (long)ini_size) {
      pvVar6 = (void *)0x0;
      pIVar7 = (ImGuiSettingsHandler *)0x0;
      pcVar8 = __dest;
      do {
        pcVar4 = pcVar8 + 2;
        for (; (*pcVar8 == '\n' || (pcVar2 = pcVar8, *pcVar8 == '\r')); pcVar8 = pcVar8 + 1) {
          pcVar4 = pcVar4 + 1;
        }
        for (; ((pcVar2 < __dest + ini_size && (*pcVar2 != '\n')) && (*pcVar2 != '\r'));
            pcVar2 = pcVar2 + 1) {
        }
        *pcVar2 = '\0';
        if (*pcVar8 != ';') {
          if (((*pcVar8 == '[') && (pcVar8 < pcVar2)) && (pcVar2[-1] == ']')) {
            pcVar2[-1] = '\0';
            pcVar8 = pcVar8 + 1;
            puVar5 = (undefined1 *)memchr(pcVar8,0x5d,(long)pcVar2 - (long)pcVar4);
            if ((puVar5 == (undefined1 *)0x0) ||
               (pvVar6 = memchr(puVar5 + 1,0x5b,(size_t)(pcVar2 + (-1 - (long)(puVar5 + 1)))),
               pvVar6 == (void *)0x0)) {
              pcVar4 = "Window";
            }
            else {
              *puVar5 = 0;
              pcVar4 = pcVar8;
              pcVar8 = (char *)((long)pvVar6 + 1);
            }
            pIVar7 = FindSettingsHandler(pcVar4);
            if (pIVar7 == (ImGuiSettingsHandler *)0x0) {
              pvVar6 = (void *)0x0;
            }
            else {
              pvVar6 = (*pIVar7->ReadOpenFn)(pIVar3,pIVar7,pcVar8);
            }
          }
          else if ((pIVar7 != (ImGuiSettingsHandler *)0x0) && (pvVar6 != (void *)0x0)) {
            (*pIVar7->ReadLineFn)(pIVar3,pIVar7,pvVar6,pcVar8);
          }
        }
        pcVar8 = pcVar2 + 1;
      } while (pcVar8 < __dest + ini_size);
    }
    if ((__dest != (char *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + -1;
    }
    (*GImAllocatorFreeFunc)(__dest,GImAllocatorUserData);
    pIVar3->SettingsLoaded = true;
    return;
  }
  __assert_fail("g.SettingsLoaded == false && g.FrameCount == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/gui/imgui/imgui.cpp"
                ,0x2449,"void ImGui::LoadIniSettingsFromMemory(const char *, size_t)");
}

Assistant:

void ImGui::LoadIniSettingsFromMemory(const char* ini_data, size_t ini_size)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.Initialized);
    IM_ASSERT(g.SettingsLoaded == false && g.FrameCount == 0);

    // For user convenience, we allow passing a non zero-terminated string (hence the ini_size parameter).
    // For our convenience and to make the code simpler, we'll also write zero-terminators within the buffer. So let's create a writable copy..
    if (ini_size == 0)
        ini_size = strlen(ini_data);
    char* buf = (char*)IM_ALLOC(ini_size + 1);
    char* buf_end = buf + ini_size;
    memcpy(buf, ini_data, ini_size);
    buf[ini_size] = 0;

    void* entry_data = NULL;
    ImGuiSettingsHandler* entry_handler = NULL;

    char* line_end = NULL;
    for (char* line = buf; line < buf_end; line = line_end + 1)
    {
        // Skip new lines markers, then find end of the line
        while (*line == '\n' || *line == '\r')
            line++;
        line_end = line;
        while (line_end < buf_end && *line_end != '\n' && *line_end != '\r')
            line_end++;
        line_end[0] = 0;
        if (line[0] == ';')
            continue;
        if (line[0] == '[' && line_end > line && line_end[-1] == ']')
        {
            // Parse "[Type][Name]". Note that 'Name' can itself contains [] characters, which is acceptable with the current format and parsing code.
            line_end[-1] = 0;
            const char* name_end = line_end - 1;
            const char* type_start = line + 1;
            char* type_end = (char*)(intptr_t)ImStrchrRange(type_start, name_end, ']');
            const char* name_start = type_end ? ImStrchrRange(type_end + 1, name_end, '[') : NULL;
            if (!type_end || !name_start)
            {
                name_start = type_start; // Import legacy entries that have no type
                type_start = "Window";
            }
            else
            {
                *type_end = 0; // Overwrite first ']'
                name_start++;  // Skip second '['
            }
            entry_handler = FindSettingsHandler(type_start);
            entry_data = entry_handler ? entry_handler->ReadOpenFn(&g, entry_handler, name_start) : NULL;
        }
        else if (entry_handler != NULL && entry_data != NULL)
        {
            // Let type handler parse the line
            entry_handler->ReadLineFn(&g, entry_handler, entry_data, line);
        }
    }
    IM_FREE(buf);
    g.SettingsLoaded = true;
}